

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  Mutex *this_00;
  Tables *this_01;
  long lVar1;
  second_type pEVar2;
  DescriptorPool *pDVar3;
  string *psVar4;
  long *plVar5;
  EnumValueOptions *pEVar6;
  size_type *psVar7;
  EnumValuesByNumberMap *collection;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string enum_value_name;
  EnumValueDescriptor *result;
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  string local_58;
  second_type local_38;
  
  local_78._M_dataplus._M_p = (pointer)parent;
  local_78._M_string_length._0_4_ = number;
  pEVar2 = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                     (&this->enum_values_by_number_,(first_type *)&local_78);
  if (pEVar2 == (second_type)0x0) {
    this_00 = &this->unknown_enum_values_mu_;
    internal::Mutex::Lock(this_00);
    collection = &this->unknown_enum_values_by_number_;
    local_78._M_dataplus._M_p = (pointer)parent;
    local_78._M_string_length._0_4_ = number;
    pEVar2 = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                       (collection,(first_type *)&local_78);
    internal::Mutex::Unlock(this_00);
    if (pEVar2 == (second_type)0x0) {
      internal::Mutex::Lock(this_00);
      local_78._M_dataplus._M_p = (pointer)parent;
      local_78._M_string_length._0_4_ = number;
      pEVar2 = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                         (collection,(first_type *)&local_78);
      if (pEVar2 == (second_type)0x0) {
        StringPrintf_abi_cxx11_
                  (&local_78,"UNKNOWN_ENUM_VALUE_%s_%d",**(undefined8 **)parent,(ulong)(uint)number)
        ;
        pDVar3 = DescriptorPool::generated_pool();
        this_01 = (pDVar3->tables_).ptr_;
        pEVar2 = (second_type)DescriptorPool::Tables::AllocateBytes(this_01,0x28);
        local_38 = pEVar2;
        psVar4 = DescriptorPool::Tables::AllocateString(this_01,&local_78);
        *(string **)pEVar2 = psVar4;
        local_98[0] = local_88;
        lVar1 = **(long **)(parent + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,lVar1,(*(long **)(parent + 8))[1] + lVar1);
        std::__cxx11::string::append((char *)local_98);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_98,(ulong)local_78._M_dataplus._M_p);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_58.field_2._M_allocated_capacity = *psVar7;
          local_58.field_2._8_8_ = plVar5[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar7;
          local_58._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_58._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        psVar4 = DescriptorPool::Tables::AllocateString(this_01,&local_58);
        *(string **)(pEVar2 + 8) = psVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        *(int *)(pEVar2 + 0x10) = number;
        *(EnumDescriptor **)(pEVar2 + 0x18) = parent;
        pEVar6 = EnumValueOptions::default_instance();
        *(EnumValueOptions **)(pEVar2 + 0x20) = pEVar6;
        local_58._M_string_length = CONCAT44(local_58._M_string_length._4_4_,number);
        local_58._M_dataplus._M_p = (pointer)parent;
        InsertIfNotPresent<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                  (collection,(first_type *)&local_58,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      internal::Mutex::Unlock(this_00);
    }
  }
  return pEVar2;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const EnumValueDescriptor* desc =
        FindPtrOrNull(enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }
  }
  // Second try, with reader lock held on unknown enum values: common case.
  {
    ReaderMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    WriterMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    string enum_value_name = StringPrintf(
        "UNKNOWN_ENUM_VALUE_%s_%d", parent->name().c_str(), number);
    DescriptorPool::Tables* tables =
        const_cast<DescriptorPool::Tables*>(DescriptorPool::generated_pool()->
                                            tables_.get());
    EnumValueDescriptor* result = tables->Allocate<EnumValueDescriptor>();
    result->name_ = tables->AllocateString(enum_value_name);
    result->full_name_ = tables->AllocateString(parent->full_name() +
                                                "." + enum_value_name);
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    InsertIfNotPresent(&unknown_enum_values_by_number_,
                       std::make_pair(parent, number), result);
    return result;
  }
}